

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findClique.cpp
# Opt level: O0

void maxCliqueHelper(CGraphIO *gio,vector<int,_std::allocator<int>_> *U,int sizeOfClique,int *maxClq
                    ,vector<int,_std::allocator<int>_> *max_clique_data_inter)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *this;
  size_type sVar2;
  long lVar3;
  reference pvVar4;
  int local_80;
  int local_7c;
  int i;
  int j;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> U_new;
  vector<int,_std::allocator<int>_> *ptrEdge;
  vector<int,_std::allocator<int>_> *ptrVertex;
  value_type_conflict local_38;
  int maxClq_prev;
  int index;
  int iPos;
  vector<int,_std::allocator<int>_> *max_clique_data_inter_local;
  int *maxClq_local;
  vector<int,_std::allocator<int>_> *pvStack_18;
  int sizeOfClique_local;
  vector<int,_std::allocator<int>_> *U_local;
  CGraphIO *gio_local;
  
  local_38 = 0;
  _index = max_clique_data_inter;
  max_clique_data_inter_local = (vector<int,_std::allocator<int>_> *)maxClq;
  maxClq_local._4_4_ = sizeOfClique;
  pvStack_18 = U;
  U_local = (vector<int,_std::allocator<int>_> *)gio;
  this = CGraphIO::GetVerticesPtr(gio);
  U_new.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CGraphIO::GetEdgesPtr((CGraphIO *)U_local);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_68);
  iVar1 = CGraphIO::GetVertexCount((CGraphIO *)U_local);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_68,(long)iVar1);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(pvStack_18);
  if (sVar2 == 0) {
    if (*(int *)&(max_clique_data_inter_local->super__Vector_base<int,_std::allocator<int>_>).
                 _M_impl.super__Vector_impl_data._M_start < maxClq_local._4_4_) {
      *(int *)&(max_clique_data_inter_local->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start = maxClq_local._4_4_;
      std::vector<int,_std::allocator<int>_>::clear(_index);
    }
  }
  else {
    while ((sVar2 = std::vector<int,_std::allocator<int>_>::size(pvStack_18), sVar2 != 0 &&
           (lVar3 = (long)maxClq_local._4_4_,
           sVar2 = std::vector<int,_std::allocator<int>_>::size(pvStack_18),
           (ulong)(long)*(int *)&(max_clique_data_inter_local->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start < lVar3 + sVar2))) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::back(pvStack_18);
      local_38 = *pvVar4;
      std::vector<int,_std::allocator<int>_>::pop_back(pvStack_18);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)local_38);
      for (local_7c = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)(local_38 + 1)),
          local_7c < *pvVar4; local_7c = local_7c + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            U_new.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)local_7c);
        iVar1 = getDegree(this,*pvVar4);
        if (iVar1 < *(int *)&(max_clique_data_inter_local->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) {
          pruned3 = pruned3 + 1;
        }
        else {
          for (local_80 = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(pvStack_18),
              (ulong)(long)local_80 < sVar2; local_80 = local_80 + 1) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                U_new.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)local_7c);
            iVar1 = *pvVar4;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_18,(long)local_80);
            if (iVar1 == *pvVar4) {
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)
                                  U_new.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,(long)local_7c);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)local_68,pvVar4);
            }
          }
        }
      }
      iVar1 = *(int *)&(max_clique_data_inter_local->super__Vector_base<int,_std::allocator<int>_>).
                       _M_impl.super__Vector_impl_data._M_start;
      maxCliqueHelper((CGraphIO *)U_local,(vector<int,_std::allocator<int>_> *)local_68,
                      maxClq_local._4_4_ + 1,(int *)max_clique_data_inter_local,_index);
      if (iVar1 < *(int *)&(max_clique_data_inter_local->
                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start) {
        std::vector<int,_std::allocator<int>_>::push_back(_index,&local_38);
      }
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_68);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  return;
}

Assistant:

void maxCliqueHelper( CGraphIO& gio, vector<int>* U, int sizeOfClique, int& maxClq, vector<int>& max_clique_data_inter )
{
	int iPos, index = 0, maxClq_prev;
	vector <int>* ptrVertex = gio.GetVerticesPtr();
	vector <int>* ptrEdge = gio.GetEdgesPtr();
	vector <int> U_new;
   U_new.reserve(gio.GetVertexCount());

	if( U->size() == 0  )
	{
		if( sizeOfClique > maxClq )
		{
			maxClq = sizeOfClique;
         max_clique_data_inter.clear();
		}
		return;
	}

	while( U->size() > 0 )
	{
		//Old Pruning
		if( sizeOfClique + U->size() <= maxClq )
			return;

		index = U->back();
		U->pop_back();

		// Loop over neighbrs of v_index.
		for(int j = (*ptrVertex)[index]; j < (*ptrVertex)[index + 1]; j++ )
			//Pruning 5
			if( getDegree(ptrVertex, (*ptrEdge)[j]) >=  maxClq )
			{
				// Loop over U.
				for(int i = 0; i < U->size(); i++)
				{
					if( (*ptrEdge)[j] == (*U)[i] )
						U_new.push_back( (*ptrEdge)[j]);
				}
			}
			else
				pruned3++;

      maxClq_prev = maxClq;

      maxCliqueHelper( gio, &U_new, sizeOfClique + 1, maxClq, max_clique_data_inter );

      if(maxClq > maxClq_prev)
         max_clique_data_inter.push_back(index);

		U_new.clear();
	}
}